

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

cali_id_t cali_create_channel(char *name,int flags,cali_configset_t cfgset)

{
  bool bVar1;
  undefined1 local_78 [8];
  Channel channel;
  Caliper c;
  undefined1 local_38 [8];
  RuntimeConfig cfg;
  cali_configset_t cfgset_local;
  int flags_local;
  char *name_local;
  
  cfg.mP.super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cfgset;
  cali::RuntimeConfig::RuntimeConfig((RuntimeConfig *)local_38);
  cali::RuntimeConfig::allow_read_env((RuntimeConfig *)local_38,SUB41((flags & 2U) >> 1,0));
  cali::RuntimeConfig::import
            ((RuntimeConfig *)local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)cfg.mP.
                super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi);
  cali::Caliper::Caliper
            ((Caliper *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cali::Caliper::create_channel
            ((Caliper *)local_78,
             (char *)&channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(RuntimeConfig *)name);
  bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_78);
  if (bVar1) {
    if ((flags & 1U) == 0) {
      cali::Caliper::activate_channel
                ((Caliper *)
                 &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Channel *)local_78);
    }
    name_local = (char *)cali::Channel::id((Channel *)local_78);
  }
  else {
    name_local = (char *)0xffffffffffffffff;
  }
  cali::Channel::~Channel((Channel *)local_78);
  cali::Caliper::~Caliper
            ((Caliper *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cali::RuntimeConfig::~RuntimeConfig((RuntimeConfig *)local_38);
  return (cali_id_t)name_local;
}

Assistant:

cali_id_t cali_create_channel(const char* name, int flags, cali_configset_t cfgset)
{
    RuntimeConfig cfg;

    cfg.allow_read_env(flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(cfgset->cfgset);

    Caliper c;
    Channel channel = c.create_channel(name, cfg);

    if (!channel)
        return CALI_INV_ID;
    if (!(flags & CALI_CHANNEL_LEAVE_INACTIVE))
        c.activate_channel(channel);

    return channel.id();
}